

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.h
# Opt level: O2

StringVector * __thiscall
CoreML::Specification::ItemSimilarityRecommender::mutable_itemstringids
          (ItemSimilarityRecommender *this)

{
  StringVector *this_00;
  
  this_00 = this->itemstringids_;
  if (this_00 == (StringVector *)0x0) {
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    this->itemstringids_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringVector* ItemSimilarityRecommender::mutable_itemstringids() {
  
  if (itemstringids_ == NULL) {
    itemstringids_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ItemSimilarityRecommender.itemStringIds)
  return itemstringids_;
}